

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packages.cpp
# Opt level: O1

bool IsChildWithParents(Package *package)

{
  element_type *peVar1;
  pointer pCVar2;
  ulong uVar3;
  const_iterator cVar4;
  pointer psVar5;
  pointer psVar6;
  __hashtable *__h;
  long lVar7;
  pointer pCVar8;
  pointer psVar9;
  long in_FS_OFFSET;
  bool bVar10;
  unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
  input_txids;
  _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  _Stack_a8;
  undefined1 *local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  psVar6 = (package->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  psVar9 = (package->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar3 = (long)psVar9 - (long)psVar6;
  psVar5 = psVar6;
  if (0 < (long)uVar3 >> 6) {
    psVar5 = (pointer)((long)&(psVar6->
                              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr + (uVar3 & 0xffffffffffffffc0));
    lVar7 = ((long)uVar3 >> 6) + 1;
    psVar6 = psVar6 + 2;
    do {
      if (psVar6[-2].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        psVar6 = psVar6 + -2;
        goto LAB_002896f0;
      }
      if (psVar6[-1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        psVar6 = psVar6 + -1;
        goto LAB_002896f0;
      }
      if ((psVar6->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
          (element_type *)0x0) goto LAB_002896f0;
      if (psVar6[1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        psVar6 = psVar6 + 1;
        goto LAB_002896f0;
      }
      lVar7 = lVar7 + -1;
      psVar6 = psVar6 + 4;
    } while (1 < lVar7);
  }
  lVar7 = (long)psVar9 - (long)psVar5 >> 4;
  if (lVar7 == 1) {
LAB_002896d3:
    psVar6 = psVar5;
    if ((psVar5->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
        (element_type *)0x0) {
      psVar6 = psVar9;
    }
  }
  else if (lVar7 == 2) {
LAB_002896c9:
    psVar6 = psVar5;
    if ((psVar5->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
        (element_type *)0x0) {
      psVar5 = psVar5 + 1;
      goto LAB_002896d3;
    }
  }
  else {
    psVar6 = psVar9;
    if ((lVar7 == 3) &&
       (psVar6 = psVar5,
       (psVar5->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
       (element_type *)0x0)) {
      psVar5 = psVar5 + 1;
      goto LAB_002896c9;
    }
  }
LAB_002896f0:
  if (psVar6 != psVar9) {
    __assert_fail("std::all_of(package.cbegin(), package.cend(), [](const auto& tx){return tx != nullptr;})"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/packages.cpp"
                  ,0x79,"bool IsChildWithParents(const Package &)");
  }
  if (uVar3 < 0x11) {
    bVar10 = false;
    goto LAB_002898ab;
  }
  SaltedTxidHasher::SaltedTxidHasher((SaltedTxidHasher *)&_Stack_a8);
  _Stack_a8._M_buckets = &_Stack_a8._M_single_bucket;
  _Stack_a8._M_bucket_count = 1;
  _Stack_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  _Stack_a8._M_element_count = 0;
  _Stack_a8._M_rehash_policy._M_max_load_factor = 1.0;
  _Stack_a8._M_rehash_policy._M_next_resize = 0;
  _Stack_a8._M_single_bucket = (__node_base_ptr)0x0;
  peVar1 = psVar9[-1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pCVar8 = (peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar2 = (peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar8 != pCVar2) {
    do {
      local_58 = *(undefined4 *)&(pCVar8->prevout).hash.m_wrapped.super_base_blob<256U>.m_data;
      uStack_54 = *(undefined4 *)
                   ((long)&(pCVar8->prevout).hash.m_wrapped.super_base_blob<256U>.m_data + 4);
      uStack_50 = *(undefined4 *)
                   ((long)&(pCVar8->prevout).hash.m_wrapped.super_base_blob<256U>.m_data + 8);
      uStack_4c = *(undefined4 *)
                   ((long)&(pCVar8->prevout).hash.m_wrapped.super_base_blob<256U>.m_data + 0xc);
      local_48 = *(undefined4 *)
                  ((long)&(pCVar8->prevout).hash.m_wrapped.super_base_blob<256U>.m_data + 0x10);
      uStack_44 = *(undefined4 *)
                   ((long)&(pCVar8->prevout).hash.m_wrapped.super_base_blob<256U>.m_data + 0x14);
      uStack_40 = *(undefined4 *)
                   ((long)&(pCVar8->prevout).hash.m_wrapped.super_base_blob<256U>.m_data + 0x18);
      uStack_3c = *(undefined4 *)
                   ((long)&(pCVar8->prevout).hash.m_wrapped.super_base_blob<256U>.m_data + 0x1c);
      local_60 = (undefined1 *)&_Stack_a8;
      std::
      _Hashtable<uint256,uint256,std::allocator<uint256>,std::__detail::_Identity,std::equal_to<uint256>,SaltedTxidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<uint256_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<uint256,true>>>>
                ((_Hashtable<uint256,uint256,std::allocator<uint256>,std::__detail::_Identity,std::equal_to<uint256>,SaltedTxidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&_Stack_a8,&local_58,&local_60);
      pCVar8 = pCVar8 + 1;
    } while (pCVar8 != pCVar2);
  }
  psVar6 = (package->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  psVar9 = (package->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_finish + -1;
  lVar7 = (long)psVar9 - (long)psVar6 >> 6;
  if (0 < lVar7) {
    lVar7 = lVar7 + 1;
    psVar6 = psVar6 + 2;
    do {
      psVar5 = psVar6;
      cVar4 = std::
              _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&_Stack_a8,
                     &((psVar5[-2].
                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      hash).m_wrapped);
      if (cVar4.super__Node_iterator_base<uint256,_true>._M_cur == (__node_type *)0x0) {
        psVar5 = psVar5 + -2;
        goto LAB_0028989d;
      }
      cVar4 = std::
              _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&_Stack_a8,
                     &((psVar5[-1].
                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      hash).m_wrapped);
      if (cVar4.super__Node_iterator_base<uint256,_true>._M_cur == (__node_type *)0x0) {
        psVar5 = psVar5 + -1;
        goto LAB_0028989d;
      }
      cVar4 = std::
              _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&_Stack_a8,
                     &(((psVar5->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr)->hash).m_wrapped);
      if (cVar4.super__Node_iterator_base<uint256,_true>._M_cur == (__node_type *)0x0)
      goto LAB_0028989d;
      cVar4 = std::
              _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&_Stack_a8,
                     &((psVar5[1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->hash).m_wrapped);
      if (cVar4.super__Node_iterator_base<uint256,_true>._M_cur == (__node_type *)0x0) {
        psVar5 = psVar5 + 1;
        goto LAB_0028989d;
      }
      lVar7 = lVar7 + -1;
      psVar6 = psVar5 + 4;
    } while (1 < lVar7);
    psVar6 = psVar5 + 2;
  }
  lVar7 = (long)psVar9 - (long)psVar6 >> 4;
  if (lVar7 == 1) {
LAB_00289871:
    cVar4 = std::
            _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find(&_Stack_a8,
                   &(((psVar6->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->hash).m_wrapped);
    psVar5 = psVar6;
    if (cVar4.super__Node_iterator_base<uint256,_true>._M_cur != (__node_type *)0x0) {
      psVar5 = psVar9;
    }
  }
  else if (lVar7 == 2) {
LAB_00289858:
    cVar4 = std::
            _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find(&_Stack_a8,
                   &(((psVar6->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->hash).m_wrapped);
    psVar5 = psVar6;
    if (cVar4.super__Node_iterator_base<uint256,_true>._M_cur != (__node_type *)0x0) {
      psVar6 = psVar6 + 1;
      goto LAB_00289871;
    }
  }
  else {
    psVar5 = psVar9;
    if ((lVar7 == 3) &&
       (cVar4 = std::
                _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(&_Stack_a8,
                       &(((psVar6->
                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                         )->hash).m_wrapped), psVar5 = psVar6,
       cVar4.super__Node_iterator_base<uint256,_true>._M_cur != (__node_type *)0x0)) {
      psVar6 = psVar6 + 1;
      goto LAB_00289858;
    }
  }
LAB_0028989d:
  bVar10 = psVar5 == psVar9;
  std::
  _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&_Stack_a8);
LAB_002898ab:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar10;
}

Assistant:

bool IsChildWithParents(const Package& package)
{
    assert(std::all_of(package.cbegin(), package.cend(), [](const auto& tx){return tx != nullptr;}));
    if (package.size() < 2) return false;

    // The package is expected to be sorted, so the last transaction is the child.
    const auto& child = package.back();
    std::unordered_set<uint256, SaltedTxidHasher> input_txids;
    std::transform(child->vin.cbegin(), child->vin.cend(),
                   std::inserter(input_txids, input_txids.end()),
                   [](const auto& input) { return input.prevout.hash; });

    // Every transaction must be a parent of the last transaction in the package.
    return std::all_of(package.cbegin(), package.cend() - 1,
                       [&input_txids](const auto& ptx) { return input_txids.count(ptx->GetHash()) > 0; });
}